

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  void *pvVar2;
  PointerStringPair camelcase_key;
  PointerStringPair lowercase_key;
  FieldDescriptor *local_68;
  first_type local_60;
  second_type local_48;
  first_type local_40;
  
  local_68 = field;
  pvVar2 = FindParentForFieldsByMap(this,field);
  local_40.first = pvVar2;
  stringpiece_internal::StringPiece::StringPiece
            (&local_40.second,*(char **)(*(long *)(field + 8) + (ulong)(((byte)field[3] & 3) << 5)))
  ;
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                    ((this->fields_by_lowercase_name_tmp_)._M_t.
                     super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
                     ._M_head_impl,&local_40,&local_68);
  if (!bVar1) {
    local_60.first =
         FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                   ((this->fields_by_lowercase_name_tmp_)._M_t.
                    super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
                    ._M_head_impl,&local_40);
    InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
              (&this->fields_by_lowercase_name_,&local_40,(second_type *)&local_60);
  }
  local_60.first = pvVar2;
  stringpiece_internal::StringPiece::StringPiece
            (&local_60.second,*(char **)(*(long *)(field + 8) + (ulong)((byte)field[3] & 0xc) * 8));
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                    ((this->fields_by_camelcase_name_tmp_)._M_t.
                     super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
                     ._M_head_impl,&local_60,&local_68);
  if (!bVar1) {
    local_48 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                         ((this->fields_by_camelcase_name_tmp_)._M_t.
                          super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                          .
                          super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
                          ._M_head_impl,&local_60);
    InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
              (&this->fields_by_camelcase_name_,&local_60,&local_48);
  }
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent = FindParentForFieldsByMap(field);

  // We want fields_by_{lower,camel}case_name_ to be lazily built, but
  // cross-link order determines which entry will be present in the case of a
  // conflict. So we use the temporary maps that get destroyed after
  // BuildFileImpl() to detect the conflicts, and only store the conflicts in
  // the map that will persist. We will then lazily populate the rest of the
  // entries from fields_by_number_.

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  if (!InsertIfNotPresent(fields_by_lowercase_name_tmp_.get(),
                               lowercase_key, field)) {
    InsertIfNotPresent(
        &fields_by_lowercase_name_, lowercase_key,
        FindPtrOrNull(*fields_by_lowercase_name_tmp_, lowercase_key));
  }

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  if (!InsertIfNotPresent(fields_by_camelcase_name_tmp_.get(),
                               camelcase_key, field)) {
    InsertIfNotPresent(
        &fields_by_camelcase_name_, camelcase_key,
        FindPtrOrNull(*fields_by_camelcase_name_tmp_, camelcase_key));
  }
}